

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_parse_login_details
                   (char *login,size_t len,char **userp,char **passwdp,char **optionsp)

{
  size_t sVar1;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t llen;
  size_t olen;
  size_t plen;
  size_t ulen;
  char *osep;
  char *psep;
  char *obuf;
  char *pbuf;
  char *ubuf;
  CURLcode result;
  char **optionsp_local;
  char **passwdp_local;
  char **userp_local;
  size_t len_local;
  char *login_local;
  
  ubuf._4_4_ = CURLE_OK;
  pbuf = (char *)0x0;
  obuf = (char *)0x0;
  psep = (char *)0x0;
  osep = (char *)0x0;
  ulen = 0;
  sVar1 = strlen(login);
  if (sVar1 < 0x7a1201) {
    if ((passwdp != (char **)0x0) && (osep = strchr(login,0x3a), login + len <= osep)) {
      osep = (char *)0x0;
    }
    if ((optionsp != (char **)0x0) && (ulen = (size_t)strchr(login,0x3b), login + len <= ulen)) {
      ulen = 0;
    }
    if (osep == (char *)0x0) {
      local_a0 = len;
      if (ulen != 0) {
        local_a0 = ulen - (long)login;
      }
      local_98 = local_a0;
    }
    else {
      if ((ulen == 0) || (osep <= ulen)) {
        local_90 = (long)osep - (long)login;
      }
      else {
        local_90 = ulen - (long)login;
      }
      local_98 = local_90;
    }
    if (osep == (char *)0x0) {
      local_b0 = (char *)0x0;
    }
    else {
      if ((ulen == 0) || (ulen <= osep)) {
        local_a8 = login + (len - (long)osep);
      }
      else {
        local_a8 = (char *)(ulen - (long)osep);
      }
      local_b0 = local_a8 + -1;
    }
    if (ulen == 0) {
      local_c0 = (char *)0x0;
    }
    else {
      if ((osep == (char *)0x0) || (osep <= ulen)) {
        local_b8 = login + (len - ulen);
      }
      else {
        local_b8 = osep + -ulen;
      }
      local_c0 = local_b8 + -1;
    }
    if ((userp != (char **)0x0) &&
       (pbuf = (char *)(*Curl_cmalloc)(local_98 + 1), pbuf == (char *)0x0)) {
      ubuf._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    if ((((ubuf._4_4_ == CURLE_OK) && (passwdp != (char **)0x0)) && (osep != (char *)0x0)) &&
       (obuf = (char *)(*Curl_cmalloc)((size_t)(local_b0 + 1)), obuf == (char *)0x0)) {
      (*Curl_cfree)(pbuf);
      ubuf._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    if (((ubuf._4_4_ == CURLE_OK) && (optionsp != (char **)0x0)) &&
       ((local_c0 != (char *)0x0 &&
        (psep = (char *)(*Curl_cmalloc)((size_t)(local_c0 + 1)), psep == (char *)0x0)))) {
      (*Curl_cfree)(obuf);
      (*Curl_cfree)(pbuf);
      ubuf._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    if (ubuf._4_4_ == CURLE_OK) {
      if (pbuf != (char *)0x0) {
        memcpy(pbuf,login,local_98);
        pbuf[local_98] = '\0';
        (*Curl_cfree)(*userp);
        *userp = (char *)0x0;
        *userp = pbuf;
      }
      if (obuf != (char *)0x0) {
        memcpy(obuf,osep + 1,(size_t)local_b0);
        obuf[(long)local_b0] = '\0';
        (*Curl_cfree)(*passwdp);
        *passwdp = (char *)0x0;
        *passwdp = obuf;
      }
      if (psep != (char *)0x0) {
        memcpy(psep,(void *)(ulen + 1),(size_t)local_c0);
        psep[(long)local_c0] = '\0';
        (*Curl_cfree)(*optionsp);
        *optionsp = (char *)0x0;
        *optionsp = psep;
      }
    }
    login_local._4_4_ = ubuf._4_4_;
  }
  else {
    login_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  return login_local._4_4_;
}

Assistant:

CURLcode Curl_parse_login_details(const char *login, const size_t len,
                                  char **userp, char **passwdp,
                                  char **optionsp)
{
  CURLcode result = CURLE_OK;
  char *ubuf = NULL;
  char *pbuf = NULL;
  char *obuf = NULL;
  const char *psep = NULL;
  const char *osep = NULL;
  size_t ulen;
  size_t plen;
  size_t olen;

  /* the input length check is because this is called directly from setopt
     and isn't going through the regular string length check */
  size_t llen = strlen(login);
  if(llen > CURL_MAX_INPUT_LENGTH)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  /* Attempt to find the password separator */
  if(passwdp) {
    psep = strchr(login, ':');

    /* Within the constraint of the login string */
    if(psep >= login + len)
      psep = NULL;
  }

  /* Attempt to find the options separator */
  if(optionsp) {
    osep = strchr(login, ';');

    /* Within the constraint of the login string */
    if(osep >= login + len)
      osep = NULL;
  }

  /* Calculate the portion lengths */
  ulen = (psep ?
          (size_t)(osep && psep > osep ? osep - login : psep - login) :
          (osep ? (size_t)(osep - login) : len));
  plen = (psep ?
          (osep && osep > psep ? (size_t)(osep - psep) :
                                 (size_t)(login + len - psep)) - 1 : 0);
  olen = (osep ?
          (psep && psep > osep ? (size_t)(psep - osep) :
                                 (size_t)(login + len - osep)) - 1 : 0);

  /* Allocate the user portion buffer, which can be zero length */
  if(userp) {
    ubuf = malloc(ulen + 1);
    if(!ubuf)
      result = CURLE_OUT_OF_MEMORY;
  }

  /* Allocate the password portion buffer */
  if(!result && passwdp && psep) {
    pbuf = malloc(plen + 1);
    if(!pbuf) {
      free(ubuf);
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  /* Allocate the options portion buffer */
  if(!result && optionsp && olen) {
    obuf = malloc(olen + 1);
    if(!obuf) {
      free(pbuf);
      free(ubuf);
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  if(!result) {
    /* Store the user portion if necessary */
    if(ubuf) {
      memcpy(ubuf, login, ulen);
      ubuf[ulen] = '\0';
      Curl_safefree(*userp);
      *userp = ubuf;
    }

    /* Store the password portion if necessary */
    if(pbuf) {
      memcpy(pbuf, psep + 1, plen);
      pbuf[plen] = '\0';
      Curl_safefree(*passwdp);
      *passwdp = pbuf;
    }

    /* Store the options portion if necessary */
    if(obuf) {
      memcpy(obuf, osep + 1, olen);
      obuf[olen] = '\0';
      Curl_safefree(*optionsp);
      *optionsp = obuf;
    }
  }

  return result;
}